

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_TestTwoBoundaryFiles::_Run(_Test_TestTwoBoundaryFiles *this)

{
  pointer *pppFVar1;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  FileMetaData *pFVar2;
  FileMetaData *pFVar3;
  FileMetaData *pFVar4;
  iterator iVar5;
  FileMetaData *f1;
  FileMetaData *f3;
  FileMetaData *f2;
  FileMetaData *local_2b8;
  FileMetaData *local_2b0;
  FileMetaData *local_2a8;
  Slice local_2a0;
  int local_28c;
  InternalKey local_288;
  InternalKey local_268;
  InternalKey local_248;
  InternalKey local_228;
  InternalKey local_208;
  InternalKey local_1e8;
  Tester local_1c8;
  
  local_1c8._0_8_ = "100";
  local_1c8.fname_ = (char *)0x3;
  InternalKey::InternalKey(&local_1e8,(Slice *)&local_1c8,6,kTypeValue);
  local_2a0.data_ = "100";
  local_2a0.size_ = 3;
  InternalKey::InternalKey(&local_208,&local_2a0,5,kTypeValue);
  pFVar2 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_1e8,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.rep_._M_dataplus._M_p != &local_208.rep_.field_2) {
    operator_delete(local_208.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.rep_._M_dataplus._M_p != &local_1e8.rep_.field_2) {
    operator_delete(local_1e8.rep_._M_dataplus._M_p);
  }
  local_1c8._0_8_ = "100";
  local_1c8.fname_ = (char *)0x3;
  local_2b8 = pFVar2;
  InternalKey::InternalKey(&local_228,(Slice *)&local_1c8,2,kTypeValue);
  local_2a0.data_ = "300";
  local_2a0.size_ = 3;
  InternalKey::InternalKey(&local_248,&local_2a0,1,kTypeValue);
  pFVar3 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_228,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.rep_._M_dataplus._M_p != &local_248.rep_.field_2) {
    operator_delete(local_248.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.rep_._M_dataplus._M_p != &local_228.rep_.field_2) {
    operator_delete(local_228.rep_._M_dataplus._M_p);
  }
  local_1c8._0_8_ = "100";
  local_1c8.fname_ = (char *)0x3;
  local_2a8 = pFVar3;
  InternalKey::InternalKey(&local_268,(Slice *)&local_1c8,4,kTypeValue);
  local_2a0.data_ = "100";
  local_2a0.size_ = 3;
  InternalKey::InternalKey(&local_288,&local_2a0,3,kTypeValue);
  pFVar4 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_268,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.rep_._M_dataplus._M_p != &local_288.rep_.field_2) {
    operator_delete(local_288.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.rep_._M_dataplus._M_p != &local_268.rep_.field_2) {
    operator_delete(local_268.rep_._M_dataplus._M_p);
  }
  iVar5._M_current =
       (this->super_AddBoundaryInputsTest).level_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_2b0 = pFVar4;
  if (iVar5._M_current ==
      (this->super_AddBoundaryInputsTest).level_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this,iVar5,
               &local_2a8);
    iVar5._M_current =
         (this->super_AddBoundaryInputsTest).level_files_.
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar5._M_current = pFVar3;
    iVar5._M_current =
         (this->super_AddBoundaryInputsTest).level_files_.
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->super_AddBoundaryInputsTest).level_files_.
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  if (iVar5._M_current ==
      (this->super_AddBoundaryInputsTest).level_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this,iVar5,
               &local_2b0);
    iVar5._M_current =
         (this->super_AddBoundaryInputsTest).level_files_.
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar5._M_current = pFVar4;
    iVar5._M_current =
         (this->super_AddBoundaryInputsTest).level_files_.
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->super_AddBoundaryInputsTest).level_files_.
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  if (iVar5._M_current ==
      (this->super_AddBoundaryInputsTest).level_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this,iVar5,
               &local_2b8);
  }
  else {
    *iVar5._M_current = pFVar2;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).level_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  this_00 = &(this->super_AddBoundaryInputsTest).compaction_files_;
  iVar5._M_current =
       (this->super_AddBoundaryInputsTest).compaction_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->super_AddBoundaryInputsTest).compaction_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this_00,
               iVar5,&local_2b8);
  }
  else {
    *iVar5._M_current = local_2b8;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).compaction_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  AddBoundaryInputs(&(this->super_AddBoundaryInputsTest).icmp_,
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    this,this_00);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1c8.line_ = 0x129;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1c8 + 0x18));
  local_28c = 3;
  local_2a0.data_ =
       (char *)((long)(this->super_AddBoundaryInputsTest).compaction_files_.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_AddBoundaryInputsTest).compaction_files_.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
  test::Tester::IsEq<int,unsigned_long>(&local_1c8,&local_28c,(unsigned_long *)&local_2a0);
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1c8.line_ = 0x12a;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1c8 + 0x18));
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>
            (&local_1c8,&local_2b8,
             (this_00->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_start);
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1c8.line_ = 299;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1c8 + 0x18));
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>
            (&local_1c8,&local_2b0,
             (this_00->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_start + 1);
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1c8.line_ = 300;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1c8 + 0x18));
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>
            (&local_1c8,&local_2a8,
             (this_00->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_start + 2);
  test::Tester::~Tester(&local_1c8);
  return;
}

Assistant:

TEST(AddBoundaryInputsTest, TestTwoBoundaryFiles) {
  FileMetaData* f1 =
      CreateFileMetaData(1, InternalKey("100", 6, kTypeValue),
                         InternalKey(InternalKey("100", 5, kTypeValue)));
  FileMetaData* f2 =
      CreateFileMetaData(1, InternalKey("100", 2, kTypeValue),
                         InternalKey(InternalKey("300", 1, kTypeValue)));
  FileMetaData* f3 =
      CreateFileMetaData(1, InternalKey("100", 4, kTypeValue),
                         InternalKey(InternalKey("100", 3, kTypeValue)));

  level_files_.push_back(f2);
  level_files_.push_back(f3);
  level_files_.push_back(f1);
  compaction_files_.push_back(f1);

  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_EQ(3, compaction_files_.size());
  ASSERT_EQ(f1, compaction_files_[0]);
  ASSERT_EQ(f3, compaction_files_[1]);
  ASSERT_EQ(f2, compaction_files_[2]);
}